

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

int __thiscall
cmMakefile::ConfigureFile
          (cmMakefile *this,string *infile,string *outfile,bool copyonly,bool atOnly,
          bool escapeQuotes,mode_t permissions,cmNewLineStyle newLine)

{
  pointer pcVar1;
  pointer ppcVar2;
  bool bVar3;
  BOM BVar4;
  long lVar5;
  Status SVar6;
  long *plVar7;
  ostream *poVar8;
  size_type *psVar9;
  int iVar10;
  _Ios_Openmode _Var11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string soutfile;
  string newLineCharacters;
  string tempOutputFile;
  string path;
  string inLine;
  ofstream fout;
  string local_650;
  string local_630;
  string local_610;
  char *local_5f0;
  char *local_5e8;
  char local_5e0;
  undefined7 uStack_5df;
  string local_5d0;
  string local_5b0;
  byte abStack_590 [488];
  undefined1 local_3a8 [112];
  ios_base local_338 [264];
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  bVar3 = CanIWriteThisFile(this,outfile);
  if (!bVar3) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   "Attempt to write file: ",outfile);
    plVar7 = (long *)std::__cxx11::string::append((char *)local_230);
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_5b0.field_2._M_allocated_capacity = *psVar9;
      local_5b0.field_2._8_8_ = plVar7[3];
    }
    else {
      local_5b0.field_2._M_allocated_capacity = *psVar9;
      local_5b0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_5b0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    cmSystemTools::Error(&local_5b0);
LAB_00230a52:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
    }
    return 0;
  }
  bVar3 = cmsys::SystemTools::FileExists(infile);
  if (!bVar3) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   "File ",infile);
    plVar7 = (long *)std::__cxx11::string::append((char *)local_230);
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_5b0.field_2._M_allocated_capacity = *psVar9;
      local_5b0.field_2._8_8_ = plVar7[3];
    }
    else {
      local_5b0.field_2._M_allocated_capacity = *psVar9;
      local_5b0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_5b0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    cmSystemTools::Error(&local_5b0);
    goto LAB_00230a52;
  }
  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
  pcVar1 = (outfile->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_630,pcVar1,pcVar1 + outfile->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFiles,infile);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_630);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->OutputFiles,&local_630);
  if (permissions == 0) {
    cmsys::SystemTools::GetPermissions(infile,&permissions);
  }
  lVar5 = std::__cxx11::string::rfind((char)&local_630,0x2f);
  if (lVar5 != -1) {
    std::__cxx11::string::substr((ulong)&local_5b0,(ulong)&local_630);
    cmsys::SystemTools::MakeDirectory(&local_5b0,(mode_t *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
  }
  if (copyonly) {
    SVar6 = cmsys::SystemTools::CopyFileIfDifferent(infile,&local_630);
    if (SVar6.Kind_ == Success) {
      SVar6 = cmsys::SystemTools::SetPermissions(&local_630,permissions,false);
      if (SVar6.Kind_ == Success) {
        iVar10 = 1;
        goto LAB_00230e94;
      }
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      ppcVar2 = (this->ExecutionStatusStack).
                super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((this->ExecutionStatusStack).
          super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
          super__Vector_impl_data._M_start != ppcVar2) {
        ppcVar2[-1]->NestedError = true;
      }
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&local_5b0,
                          &this->Backtrace);
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      ppcVar2 = (this->ExecutionStatusStack).
                super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((this->ExecutionStatusStack).
          super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
          super__Vector_impl_data._M_start != ppcVar2) {
        ppcVar2[-1]->NestedError = true;
      }
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&local_5b0,
                          &this->Backtrace);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
    iVar10 = 0;
    goto LAB_00230e94;
  }
  local_5f0 = &local_5e0;
  local_5e8 = (char *)0x0;
  local_5e0 = '\0';
  bVar3 = cmNewLineStyle::IsValid(&newLine);
  if (bVar3) {
    cmNewLineStyle::GetCharacters_abi_cxx11_(&local_5b0,&newLine);
    std::__cxx11::string::operator=((string *)&local_5f0,(string *)&local_5b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
    _Var11 = _S_trunc|_S_out|_S_bin;
  }
  else {
    _Var11 = _S_trunc|_S_out;
    std::__cxx11::string::_M_replace((ulong)&local_5f0,0,local_5e8,0x70d3d9);
  }
  local_5b0._M_dataplus._M_p = (pointer)local_630._M_string_length;
  local_5b0._M_string_length = (size_type)local_630._M_dataplus._M_p;
  local_5b0.field_2._M_allocated_capacity = 4;
  local_5b0.field_2._8_8_ = (long)"%s.%s.tmp" + 5;
  views._M_len = 2;
  views._M_array = (iterator)&local_5b0;
  cmCatViews_abi_cxx11_(&local_5d0,views);
  std::ofstream::ofstream(local_230,local_5d0._M_dataplus._M_p,_Var11);
  if ((abStack_210[*(long *)(local_230._0_8_ + -0x18)] & 5) == 0) {
    std::ifstream::ifstream(&local_5b0,(infile->_M_dataplus)._M_p,_S_in);
    if ((abStack_590[*(long *)(local_5b0._M_dataplus._M_p + -0x18)] & 5) == 0) {
      BVar4 = cmsys::FStream::ReadBOM((istream *)&local_5b0);
      if (BOM_UTF8 < BVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3a8,"File starts with a Byte-Order-Mark that is not UTF-8:\n  ",
                   0x38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3a8,(infile->_M_dataplus)._M_p,infile->_M_string_length);
        std::__cxx11::stringbuf::str();
        IssueMessage(this,FATAL_ERROR,&local_650);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_650._M_dataplus._M_p != &local_650.field_2) {
          operator_delete(local_650._M_dataplus._M_p,
                          CONCAT71(local_650.field_2._M_allocated_capacity._1_7_,
                                   local_650.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
        std::ios_base::~ios_base(local_338);
        goto LAB_00230e15;
      }
      std::istream::seekg(&local_5b0,0,0);
      local_3a8._0_8_ = local_3a8 + 0x10;
      local_3a8._8_8_ = 0;
      local_3a8[0x10] = '\0';
      local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
      local_650._M_string_length = 0;
      local_650.field_2._M_local_buf[0] = '\0';
      while (bVar3 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)&local_5b0,(string *)local_3a8,(bool *)0x0,
                                0xffffffffffffffff), bVar3) {
        local_650._M_string_length = 0;
        *local_650._M_dataplus._M_p = '\0';
        ConfigureString(this,(string *)local_3a8,&local_650,atOnly,escapeQuotes);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,local_650._M_dataplus._M_p,
                            local_650._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_5f0,(long)local_5e8);
      }
      std::ifstream::close();
      std::ofstream::close();
      SVar6 = cmsys::SystemTools::CopyFileIfDifferent(&local_5d0,&local_630);
      if (SVar6.Kind_ == Success) {
        SVar6 = cmsys::SystemTools::SetPermissions(&local_630,permissions,false);
        if (SVar6.Kind_ != Success) {
          cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
          IssueMessage(this,FATAL_ERROR,&local_610);
          goto LAB_00230f43;
        }
        iVar10 = 1;
      }
      else {
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        IssueMessage(this,FATAL_ERROR,&local_610);
LAB_00230f43:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610._M_dataplus._M_p != &local_610.field_2) {
          operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
        }
        iVar10 = 0;
      }
      cmsys::SystemTools::RemoveFile(&local_5d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_650._M_dataplus._M_p != &local_650.field_2) {
        operator_delete(local_650._M_dataplus._M_p,
                        CONCAT71(local_650.field_2._M_allocated_capacity._1_7_,
                                 local_650.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
        operator_delete((void *)local_3a8._0_8_,CONCAT71(local_3a8._17_7_,local_3a8[0x10]) + 1);
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
                     "Could not open file for read in copy operation ",infile);
      cmSystemTools::Error((string *)local_3a8);
      if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
        operator_delete((void *)local_3a8._0_8_,CONCAT71(local_3a8._17_7_,local_3a8[0x10]) + 1);
      }
LAB_00230e15:
      iVar10 = 0;
    }
    std::ifstream::~ifstream(&local_5b0);
  }
  else {
    std::operator+(&local_5b0,"Could not open file for write in copy operation ",&local_5d0);
    cmSystemTools::Error(&local_5b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
    iVar10 = 0;
    cmSystemTools::ReportLastSystemError("");
  }
  local_230._0_8_ = _VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = _EVP_PKEY_get_bn_param;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  if (local_5f0 != &local_5e0) {
    operator_delete(local_5f0,CONCAT71(uStack_5df,local_5e0) + 1);
  }
LAB_00230e94:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p == &local_630.field_2) {
    return iVar10;
  }
  operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
  return iVar10;
}

Assistant:

int cmMakefile::ConfigureFile(const std::string& infile,
                              const std::string& outfile, bool copyonly,
                              bool atOnly, bool escapeQuotes,
                              mode_t permissions, cmNewLineStyle newLine)
{
  int res = 1;
  if (!this->CanIWriteThisFile(outfile)) {
    cmSystemTools::Error("Attempt to write file: " + outfile +
                         " into a source directory.");
    return 0;
  }
  if (!cmSystemTools::FileExists(infile)) {
    cmSystemTools::Error("File " + infile + " does not exist.");
    return 0;
  }
  std::string soutfile = outfile;
  const std::string& sinfile = infile;
  this->AddCMakeDependFile(sinfile);
  cmSystemTools::ConvertToUnixSlashes(soutfile);

  // Re-generate if non-temporary outputs are missing.
  // when we finalize the configuration we will remove all
  // output files that now don't exist.
  this->AddCMakeOutputFile(soutfile);

  if (permissions == 0) {
    cmSystemTools::GetPermissions(sinfile, permissions);
  }

  std::string::size_type pos = soutfile.rfind('/');
  if (pos != std::string::npos) {
    std::string path = soutfile.substr(0, pos);
    cmSystemTools::MakeDirectory(path);
  }

  if (copyonly) {
    if (!cmSystemTools::CopyFileIfDifferent(sinfile, soutfile)) {
      this->IssueMessage(MessageType::FATAL_ERROR,
                         cmSystemTools::GetLastSystemError());
      return 0;
    }
    if (!cmSystemTools::SetPermissions(soutfile, permissions)) {
      this->IssueMessage(MessageType::FATAL_ERROR,
                         cmSystemTools::GetLastSystemError());
      return 0;
    }
  } else {
    std::string newLineCharacters;
    std::ios::openmode omode = std::ios::out | std::ios::trunc;
    if (newLine.IsValid()) {
      newLineCharacters = newLine.GetCharacters();
      omode |= std::ios::binary;
    } else {
      newLineCharacters = "\n";
    }
    std::string tempOutputFile = cmStrCat(soutfile, ".tmp");
    cmsys::ofstream fout(tempOutputFile.c_str(), omode);
    if (!fout) {
      cmSystemTools::Error("Could not open file for write in copy operation " +
                           tempOutputFile);
      cmSystemTools::ReportLastSystemError("");
      return 0;
    }
    cmsys::ifstream fin(sinfile.c_str());
    if (!fin) {
      cmSystemTools::Error("Could not open file for read in copy operation " +
                           sinfile);
      return 0;
    }

    cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
    if (bom != cmsys::FStream::BOM_None && bom != cmsys::FStream::BOM_UTF8) {
      std::ostringstream e;
      e << "File starts with a Byte-Order-Mark that is not UTF-8:\n  "
        << sinfile;
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return 0;
    }
    // rewind to copy BOM to output file
    fin.seekg(0);

    // now copy input to output and expand variables in the
    // input file at the same time
    std::string inLine;
    std::string outLine;
    while (cmSystemTools::GetLineFromStream(fin, inLine)) {
      outLine.clear();
      this->ConfigureString(inLine, outLine, atOnly, escapeQuotes);
      fout << outLine << newLineCharacters;
    }
    // close the files before attempting to copy
    fin.close();
    fout.close();
    if (!cmSystemTools::CopyFileIfDifferent(tempOutputFile, soutfile)) {
      this->IssueMessage(MessageType::FATAL_ERROR,
                         cmSystemTools::GetLastSystemError());
      res = 0;
    } else {
      if (!cmSystemTools::SetPermissions(soutfile, permissions)) {
        this->IssueMessage(MessageType::FATAL_ERROR,
                           cmSystemTools::GetLastSystemError());
        res = 0;
      }
    }
    cmSystemTools::RemoveFile(tempOutputFile);
  }
  return res;
}